

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichHdrWrapper.cpp
# Opt level: O2

QString * __thiscall
RichHdrWrapper::getFieldName(QString *__return_storage_ptr__,RichHdrWrapper *this,size_t fieldId)

{
  size_t sVar1;
  char *ch;
  
  ch = "";
  if ((this->richSign != (RICH_SIGNATURE *)0x0) && (this->dansHdr != (RICH_DANS_HEADER *)0x0)) {
    if (fieldId < 4) {
      ch = &DAT_00133418 + *(int *)(&DAT_00133418 + fieldId * 4);
    }
    else {
      sVar1 = this->compIdCounter;
      if (sVar1 + 3 < fieldId) {
        if (sVar1 + 4 == fieldId) {
          ch = "Rich ID";
        }
        else {
          ch = "";
          if (sVar1 + 5 == fieldId) {
            ch = "Checksum";
          }
        }
      }
      else {
        ch = "Comp ID";
      }
    }
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString RichHdrWrapper::getFieldName(size_t fieldId)
{
    if (!this->richSign || !this->dansHdr) {
        return "";
    }
    const size_t cnt = this->compIdCounter - 1;

    switch (fieldId) {
         case DANS_ID: return("DanS ID");
         case CPAD0: case CPAD1: case CPAD2:  return ("Checksumed padding");
    }
    if (fieldId >= COMP_ID_1 && fieldId <= COMP_ID_1 + cnt)
    {
        return("Comp ID");
    }
    if (fieldId == RICH_ID + cnt) return("Rich ID");
    if (fieldId == CHECKSUM + cnt) return("Checksum");
    return "";
}